

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

wchar_t ego_item_name(char *buf,size_t buf_size,ego_desc *desc)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  char local_b8 [8];
  char prefix [100];
  ego_item *ego;
  char *long_name;
  size_t prefix_size;
  ulong uStack_30;
  wchar_t end;
  size_t i;
  ego_desc *desc_local;
  size_t buf_size_local;
  char *buf_local;
  
  register0x00000000 = e_info + desc->e_idx;
  for (uStack_30 = 0; (uStack_30 < 0x19 && (desc->itype != uStack_30)); uStack_30 = uStack_30 + 1) {
  }
  if (uStack_30 == 0x19) {
    buf_local._4_4_ = L'\0';
  }
  else {
    sVar1 = my_strcat(buf,"[ ] ",buf_size);
    sVar2 = my_strcat(buf,quality_choices[uStack_30].name,buf_size);
    sVar3 = my_strcat(buf," ",buf_size);
    prefix_size._4_4_ = (int)sVar1 + (int)sVar2 + (int)sVar3;
    lVar4 = (long)desc->short_name - (long)stack0xffffffffffffffb0->name;
    if (lVar4 != 0) {
      my_strcpy(local_b8,stack0xffffffffffffffb0->name,lVar4 + 1);
      sVar1 = my_strcat(buf,local_b8,buf_size);
      prefix_size._4_4_ = prefix_size._4_4_ + (int)sVar1;
    }
    buf_local._4_4_ = prefix_size._4_4_;
  }
  return buf_local._4_4_;
}

Assistant:

int ego_item_name(char *buf, size_t buf_size, struct ego_desc *desc)
{
	size_t i;
	int end;
	size_t prefix_size;
	const char *long_name;

	struct ego_item *ego = &e_info[desc->e_idx];

	/* Find the ignore type */
	for (i = 0; i < N_ELEMENTS(quality_choices); i++)
		if (desc->itype == i) break;

	if (i == N_ELEMENTS(quality_choices)) return 0;

	/* Initialize the buffer */
	end = my_strcat(buf, "[ ] ", buf_size);

	/* Append the name */
	end += my_strcat(buf, quality_choices[i].name, buf_size);

	/* Append an extra space */
	end += my_strcat(buf, " ", buf_size);

	/* Get the full ego-item name */
	long_name = ego->name;

	/* Get the length of the common prefix, if any */
	prefix_size = (desc->short_name - long_name);

	/* Found a prefix? */
	if (prefix_size > 0) {
		char prefix[100];

		/* Get a copy of the prefix */
		my_strcpy(prefix, long_name, prefix_size + 1);

		/* Append the prefix */
		end += my_strcat(buf, prefix, buf_size);
	}
	/* Set the name to the right length */
	return end;
}